

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XarLinux.cpp
# Opt level: O3

bool tools::xar::fuse_allows_visible_mounts(string *fuse_conf_path)

{
  uint uVar1;
  char cVar2;
  int iVar3;
  istream *piVar4;
  string line;
  ifstream input;
  undefined1 *local_250;
  undefined8 local_248;
  undefined1 local_240;
  undefined7 uStack_23f;
  long local_230 [65];
  
  std::ifstream::ifstream((istream *)local_230,(string *)fuse_conf_path,_S_in);
  local_248 = 0;
  local_240 = 0;
  local_250 = &local_240;
  do {
    cVar2 = std::ios::widen((char)*(undefined8 *)(local_230[0] + -0x18) + (char)(istream *)local_230
                           );
    piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_230,(string *)&local_250,cVar2);
    uVar1 = *(uint *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18) + 0x20);
    if ((uVar1 & 5) != 0) break;
    iVar3 = std::__cxx11::string::compare((char *)&local_250);
  } while (iVar3 != 0);
  if (local_250 != &local_240) {
    operator_delete(local_250,CONCAT71(uStack_23f,local_240) + 1);
  }
  std::ifstream::~ifstream(local_230);
  return (uVar1 & 5) == 0;
}

Assistant:

bool tools::xar::fuse_allows_visible_mounts(std::string fuse_conf_path) {
  std::ifstream input(fuse_conf_path);

  std::string line;
  while (std::getline(input, line)) {
    if (line == "user_allow_other") {
      return true;
    }
  }

  return false;
}